

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

int bhitpile(obj *obj,_func_int_obj_ptr_obj_ptr *fhito,int tx,int ty)

{
  ushort uVar1;
  obj *poVar2;
  int iVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  trap *trap;
  monst *pmVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  obj *poVar11;
  permonst *ptr;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  
  if ((((obj->otyp == 0x1c4) || (obj->otyp == 0x187)) &&
      (trap = t_at(level,tx,ty), trap != (trap *)0x0)) &&
     ((((trap->field_0x8 & 0x1f) == 0x14 &&
       (pmVar7 = activate_statue_trap(trap,(xchar)tx,(xchar)ty,'\x01'), pmVar7 != (monst *)0x0)) &&
      (obj->otyp == 0x1c4)))) {
    discover_object(0x1c4,'\x01','\x01');
  }
  poly_zapped = -1;
  poVar11 = level->objects[tx][ty];
  iVar10 = 0;
  if (poVar11 != (obj *)0x0) {
    do {
      poVar2 = (poVar11->v).v_nexthere;
      iVar5 = (*fhito)(poVar11,obj);
      iVar3 = poly_zapped;
      iVar10 = iVar10 + iVar5;
      poVar11 = poVar2;
    } while (poVar2 != (obj *)0x0);
    if (((-1 < poly_zapped) && (poVar11 = level->objects[tx][ty], poVar11 != (obj *)0x0)) &&
       (((poVar11->v).v_nexthere != (obj *)0x0 || (poVar11->quan != 1)))) {
      switch(poly_zapped) {
      case 0:
      case 4:
        lVar13 = 0x106;
        pcVar8 = "organic ";
        break;
      default:
        lVar13 = 0xff;
        pcVar8 = "";
        break;
      case 2:
        lVar13 = 0x101;
        pcVar8 = "wax ";
        break;
      case 5:
        lVar13 = 0x100;
        pcVar8 = "paper ";
        break;
      case 6:
        lVar13 = 0x102;
        pcVar8 = "cloth ";
        break;
      case 7:
        lVar13 = 0x104;
        pcVar8 = "leather ";
        break;
      case 8:
        lVar13 = 0x105;
        pcVar8 = "wood ";
        break;
      case 9:
        lVar13 = 0xfe;
        pcVar8 = "bony ";
        break;
      case 0xb:
      case 0xc:
      case 0x11:
        lVar13 = 0x10a;
        pcVar8 = "metal ";
        break;
      case 0xd:
      case 0xe:
      case 0x10:
      case 0x14:
      case 0x15:
        uVar12 = mt_random();
        lVar13 = (ulong)(uVar12 & 1) + 0x107;
        pcVar8 = "lithic ";
        break;
      case 0xf:
        lVar13 = 0x103;
        pcVar8 = "gold ";
        break;
      case 0x13:
        lVar13 = 0x109;
        pcVar8 = "glassy ";
      }
      uVar14 = (ulong)(uint)((int)lVar13 << 6);
      ptr = (permonst *)((long)&((permonst *)(mons[0].mattk + -4))->mname + uVar14);
      if ((mvitals[lVar13].mvflags & 2) != 0) {
        ptr = (permonst *)0x0;
      }
      pmVar7 = makemon(ptr,level,(int)poVar11->ox,(int)poVar11->oy,0);
      uVar1 = *(ushort *)((long)(mons[0].mattk + 6) + uVar14);
      uVar12 = (uint)uVar1;
      if (uVar1 != 0) {
        do {
          poVar2 = (poVar11->v).v_nexthere;
          if ((((poVar11 != uball) && (poVar11 != uchain)) &&
              (bVar4 = obj_resists(poVar11,0,0), bVar4 == '\0')) &&
             (uVar1 = *(ushort *)&objects[poVar11->otyp].field_0x11, uVar6 = mt_random(),
             (uVar6 % (uVar12 + 1) == 0) != (iVar3 == (uVar1 >> 4 & 0x1f)))) {
            bVar4 = costly_spot(poVar11->ox,poVar11->oy);
            if (bVar4 != '\0') {
              if (u.ushops[0] == '\0') {
                stolen_value(poVar11,poVar11->ox,poVar11->oy,'\0','\0');
              }
              else {
                addtobill(poVar11,'\0','\0','\0');
              }
            }
            uVar12 = uVar12 - poVar11->quan;
            if (0x7ffe < poVar11->quan) {
              uVar12 = 0;
            }
            delobj(poVar11);
          }
        } while ((0 < (int)uVar12) && (poVar11 = poVar2, poVar2 != (obj *)0x0));
      }
      if ((pmVar7 != (monst *)0x0) && ((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0)) {
        pcVar9 = a_monnam(pmVar7);
        pline("Some %sobjects meld, and %s arises from the pile!",pcVar8,pcVar9);
      }
    }
  }
  return iVar10;
}

Assistant:

int bhitpile(struct obj *obj, int (*fhito)(struct obj*,struct obj*),
	     int tx, int ty)
{
    int hitanything = 0;
    struct obj *otmp, *next_obj;

    if (obj->otyp == SPE_FORCE_BOLT || obj->otyp == WAN_STRIKING) {
	struct trap *t = t_at(level, tx, ty);

	/* We can't settle for the default calling sequence of
	   bhito(otmp) -> break_statue(otmp) -> activate_statue_trap(ox,oy)
	   because that last call might end up operating on our `next_obj'
	   (below), rather than on the current object, if it happens to
	   encounter a statue which mustn't become animated. */
	if (t && t->ttyp == STATUE_TRAP &&
	    activate_statue_trap(t, tx, ty, TRUE) && obj->otyp == WAN_STRIKING)
	    makeknown(obj->otyp);
    }

    poly_zapped = -1;
    for (otmp = level->objects[tx][ty]; otmp; otmp = next_obj) {
	/* Fix for polymorph bug, Tim Wright */
	next_obj = otmp->nexthere;
	hitanything += (*fhito)(otmp, obj);
    }
    if (poly_zapped >= 0)
	create_polymon(level->objects[tx][ty], poly_zapped);

    return hitanything;
}